

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O1

int per_put_few_bits(asn_per_outp_t *po,uint32_t bits,int obits)

{
  uint8_t *puVar1;
  byte *pbVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  char cVar6;
  ulong uVar7;
  int unaff_R13D;
  size_t sVar8;
  uint local_3c;
  
  puVar1 = po->tmpspace;
  bVar4 = false;
  local_3c = bits;
  do {
    if (obits - 0x20U < 0xffffffe1) {
      iVar5 = -(uint)(obits != 0);
LAB_0014d4a9:
      if (bVar4) {
        iVar5 = unaff_R13D;
      }
      return iVar5;
    }
    uVar7 = po->nboff;
    if (7 < uVar7) {
      po->buffer = po->buffer + (uVar7 >> 3);
      po->nbits = po->nbits - (uVar7 & 0xfffffffffffffff8);
      po->nboff = (ulong)((uint)uVar7 & 7);
    }
    if (po->nbits < po->nboff + (ulong)(uint)obits) {
      sVar8 = (size_t)(*(int *)&po->buffer - (int)puVar1);
      iVar5 = (*po->outper)(puVar1,sVar8,po->op_key);
      if (iVar5 < 0) {
        iVar5 = -1;
        goto LAB_0014d4a9;
      }
      if (po->nboff != 0) {
        po->tmpspace[0] = *po->buffer;
      }
      po->buffer = puVar1;
      po->nbits = 0x100;
      po->flushed_bytes = po->flushed_bytes + sVar8;
    }
    uVar7 = (ulong)(uint)obits + po->nboff;
    pbVar2 = po->buffer;
    local_3c = local_3c & ~(-1 << ((byte)obits & 0x1f));
    cVar6 = (char)uVar7;
    bVar3 = (byte)(-1 << (8U - (char)po->nboff & 0x1f));
    if (uVar7 < 9) {
      po->nboff = uVar7;
      *pbVar2 = bVar3 & *pbVar2 | (byte)(local_3c << (8U - cVar6 & 0x1f));
LAB_0014d4a7:
      iVar5 = 0;
      goto LAB_0014d4a9;
    }
    if (uVar7 < 0x11) {
      po->nboff = uVar7;
      iVar5 = local_3c << (0x10U - cVar6 & 0x1f);
      *pbVar2 = (byte)((uint)iVar5 >> 8) | bVar3 & *pbVar2;
      pbVar2[1] = (byte)iVar5;
      goto LAB_0014d4a7;
    }
    if (uVar7 < 0x19) {
      po->nboff = uVar7;
      iVar5 = local_3c << (0x18U - cVar6 & 0x1f);
      *pbVar2 = (byte)((uint)iVar5 >> 0x10) | bVar3 & *pbVar2;
      pbVar2[1] = (byte)((uint)iVar5 >> 8);
      pbVar2[2] = (byte)iVar5;
      goto LAB_0014d4a7;
    }
    if (uVar7 < 0x20) {
      po->nboff = uVar7;
      iVar5 = local_3c << (-cVar6 & 0x1fU);
      *pbVar2 = (byte)((uint)iVar5 >> 0x18) | bVar3 & *pbVar2;
      pbVar2[1] = (byte)((uint)iVar5 >> 0x10);
      pbVar2[2] = (byte)((uint)iVar5 >> 8);
      pbVar2[3] = (byte)iVar5;
      goto LAB_0014d4a7;
    }
    obits = obits - 0x18;
    per_put_few_bits(po,local_3c >> ((byte)obits & 0x1f),0x18);
    if (!bVar4) {
      unaff_R13D = 0;
    }
    bVar4 = true;
  } while( true );
}

Assistant:

int
per_put_few_bits(asn_per_outp_t *po, uint32_t bits, int obits) {
	size_t off;	/* Next after last bit offset */
	size_t omsk;	/* Existing last byte meaningful bits mask */
	uint8_t *buf;

	if(obits <= 0 || obits >= 32) return obits ? -1 : 0;

	ASN_DEBUG("[PER put %d bits %x to %p+%d bits]",
			obits, (int)bits, po->buffer, (int)po->nboff);

	/*
	 * Normalize position indicator.
	 */
	if(po->nboff >= 8) {
		po->buffer += (po->nboff >> 3);
		po->nbits  -= (po->nboff & ~0x07);
		po->nboff  &= 0x07;
	}

	/*
	 * Flush whole-bytes output, if necessary.
	 */
	if(po->nboff + obits > po->nbits) {
		int complete_bytes = (po->buffer - po->tmpspace);
		ASN_DEBUG("[PER output %ld complete + %ld]",
			(long)complete_bytes, (long)po->flushed_bytes);
		if(po->outper(po->tmpspace, complete_bytes, po->op_key) < 0)
			return -1;
		if(po->nboff)
			po->tmpspace[0] = po->buffer[0];
		po->buffer = po->tmpspace;
		po->nbits = 8 * sizeof(po->tmpspace);
		po->flushed_bytes += complete_bytes;
	}

	/*
	 * Now, due to sizeof(tmpspace), we are guaranteed large enough space.
	 */
	buf = po->buffer;
	omsk = ~((1 << (8 - po->nboff)) - 1);
	off = (po->nboff + obits);

	/* Clear data of debris before meaningful bits */
	bits &= (((uint32_t)1 << obits) - 1);

	ASN_DEBUG("[PER out %d %u/%x (t=%d,o=%d) %x&%x=%x]", obits,
		(int)bits, (int)bits,
		(int)po->nboff, (int)off,
		buf[0], (int)(omsk&0xff),
		(int)(buf[0] & omsk));

	if(off <= 8)	/* Completely within 1 byte */
		po->nboff = off,
		bits <<= (8 - off),
		buf[0] = (buf[0] & omsk) | bits;
	else if(off <= 16)
		po->nboff = off,
		bits <<= (16 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 8),
		buf[1] = bits;
	else if(off <= 24)
		po->nboff = off,
		bits <<= (24 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 16),
		buf[1] = bits >> 8,
		buf[2] = bits;
	else if(off <= 31)
		po->nboff = off,
		bits <<= (32 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 24),
		buf[1] = bits >> 16,
		buf[2] = bits >> 8,
		buf[3] = bits;
	else {
		per_put_few_bits(po, bits >> (obits - 24), 24);
		per_put_few_bits(po, bits, obits - 24);
	}

	ASN_DEBUG("[PER out %u/%x => %02x buf+%ld]",
		(int)bits, (int)bits, buf[0],
		(long)(po->buffer - po->tmpspace));

	return 0;
}